

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::Clear
          (SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *this)

{
  Type pHVar1;
  Type pSVar2;
  bool bVar3;
  Type *ppSVar4;
  long *plVar5;
  long extraout_RDX;
  code *local_60;
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  pHVar1 = this->allocator;
  ppSVar4 = SListNodeBase<Memory::HeapAllocator>::Next((SListNodeBase<Memory::HeapAllocator> *)this)
  ;
  next = *ppSVar4;
  while (bVar3 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
                 IsHead(&this->
                         super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                        ,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::HeapAllocator>::Next(next);
    pSVar2 = *ppSVar4;
    local_60 = (code *)Memory::
                       TypeAllocatorFunc<Memory::HeapAllocator,_Memory::RecyclerWeakReferenceRegion>
                       ::GetFreeFunc();
    plVar5 = (long *)((long)&pHVar1->m_privateHeap + extraout_RDX);
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *plVar5 + -1);
    }
    (*local_60)(plVar5,next,0x20);
    next = pSVar2;
  }
  SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::Reset
            (&this->
              super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
            );
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }